

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000193300 = 0x2d2d2d2d2d2d2d;
    uRam0000000000193307._0_1_ = '-';
    uRam0000000000193307._1_1_ = '-';
    uRam0000000000193307._2_1_ = '-';
    uRam0000000000193307._3_1_ = '-';
    uRam0000000000193307._4_1_ = '-';
    uRam0000000000193307._5_1_ = '-';
    uRam0000000000193307._6_1_ = '-';
    uRam0000000000193307._7_1_ = '-';
    DAT_001932f0 = '-';
    DAT_001932f0_1._0_1_ = '-';
    DAT_001932f0_1._1_1_ = '-';
    DAT_001932f0_1._2_1_ = '-';
    DAT_001932f0_1._3_1_ = '-';
    DAT_001932f0_1._4_1_ = '-';
    DAT_001932f0_1._5_1_ = '-';
    DAT_001932f0_1._6_1_ = '-';
    uRam00000000001932f8 = 0x2d2d2d2d2d2d2d;
    DAT_001932ff = 0x2d;
    DAT_001932e0 = '-';
    DAT_001932e0_1._0_1_ = '-';
    DAT_001932e0_1._1_1_ = '-';
    DAT_001932e0_1._2_1_ = '-';
    DAT_001932e0_1._3_1_ = '-';
    DAT_001932e0_1._4_1_ = '-';
    DAT_001932e0_1._5_1_ = '-';
    DAT_001932e0_1._6_1_ = '-';
    uRam00000000001932e8._0_1_ = '-';
    uRam00000000001932e8._1_1_ = '-';
    uRam00000000001932e8._2_1_ = '-';
    uRam00000000001932e8._3_1_ = '-';
    uRam00000000001932e8._4_1_ = '-';
    uRam00000000001932e8._5_1_ = '-';
    uRam00000000001932e8._6_1_ = '-';
    uRam00000000001932e8._7_1_ = '-';
    DAT_001932d0 = '-';
    DAT_001932d0_1._0_1_ = '-';
    DAT_001932d0_1._1_1_ = '-';
    DAT_001932d0_1._2_1_ = '-';
    DAT_001932d0_1._3_1_ = '-';
    DAT_001932d0_1._4_1_ = '-';
    DAT_001932d0_1._5_1_ = '-';
    DAT_001932d0_1._6_1_ = '-';
    uRam00000000001932d8._0_1_ = '-';
    uRam00000000001932d8._1_1_ = '-';
    uRam00000000001932d8._2_1_ = '-';
    uRam00000000001932d8._3_1_ = '-';
    uRam00000000001932d8._4_1_ = '-';
    uRam00000000001932d8._5_1_ = '-';
    uRam00000000001932d8._6_1_ = '-';
    uRam00000000001932d8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001932c8._0_1_ = '-';
    uRam00000000001932c8._1_1_ = '-';
    uRam00000000001932c8._2_1_ = '-';
    uRam00000000001932c8._3_1_ = '-';
    uRam00000000001932c8._4_1_ = '-';
    uRam00000000001932c8._5_1_ = '-';
    uRam00000000001932c8._6_1_ = '-';
    uRam00000000001932c8._7_1_ = '-';
    DAT_0019330f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}